

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_io.c
# Opt level: O0

int mriStep_GetCurrentGamma(ARKodeMem ark_mem,sunrealtype *gamma)

{
  int iVar1;
  ARKodeMem in_RSI;
  ARKodeMRIStepMem step_mem;
  int retval;
  ARKodeMRIStepMem *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  iVar1 = mriStep_AccessStepMem
                    (in_RSI,(char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffd8);
  if (iVar1 == 0) {
    in_RSI->sunctx = (SUNContext_conflict)in_stack_ffffffffffffffd8[0x16];
  }
  return iVar1;
}

Assistant:

int mriStep_GetCurrentGamma(ARKodeMem ark_mem, sunrealtype* gamma)
{
  int retval;
  ARKodeMRIStepMem step_mem;
  retval = mriStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }
  *gamma = step_mem->gamma;
  return (retval);
}